

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O2

void __thiscall cppcms::impl::file_server::list_dir(file_server *this,string *url,string *path)

{
  bool bVar1;
  int iVar2;
  response *this_00;
  ostream *out;
  ostream *poVar3;
  undefined7 in_register_00000009;
  char *__format;
  char *pcVar4;
  undefined1 uVar5;
  port_stat st;
  directory d;
  allocator local_276;
  allocator local_275;
  uint local_274;
  string *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  stat local_228;
  string local_198;
  string local_178;
  directory local_158;
  
  local_158.dir_ = (DIR *)0x0;
  local_158.entry_p_ = (dirent *)0x0;
  local_270 = path;
  iVar2 = directory::open(&local_158,(char *)path,(int)path);
  if ((char)iVar2 == '\0') {
    show404(this);
  }
  else {
    this_00 = application::response(&this->super_application);
    out = http::response::out(this_00);
    std::operator<<(out,
                    "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n     \"http://www.w3.org/TR/html4/loose.dtd\">\n"
                   );
    poVar3 = std::operator<<(out,
                             "<html><head><title>Directory Listing</title></head>\n<body><h1>Index of "
                            );
    util::escape((string *)&local_228,url);
    poVar3 = std::operator<<(poVar3,(string *)&local_228);
    std::operator<<(poVar3,"</h1>\n");
    std::__cxx11::string::~string((string *)&local_228);
    booster::locale::as::gmt((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
    std::operator<<(out,"<table>\n");
    std::operator<<(out,
                    "<thead><tr><td width=\'60%\'>File</td><td width=\'20%\' >Date</td><td width=\'5%\'>&nbsp;</td><td width=\'15%\'>Size</td></tr></thead>\n<tbody>\n"
                   );
    bVar1 = std::operator!=(url,"/");
    uVar5 = url->_M_string_length != 0;
    if (bVar1 && (bool)uVar5) {
      std::operator<<(out,
                      "<tr><td><code><a href=\'../\' >..</a></code></td><td>&nbsp;</td><td>&nbsp;</td><td>&nbsp;</td></tr>\n"
                     );
    }
    booster::locale::as::ftime<char>((add_ftime<char> *)&local_228,"%Y-%m-%d %H:%M:%S");
    booster::locale::as::details::operator<<(out,(add_ftime<char> *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
LAB_0021b2c1:
    bVar1 = directory::next(&local_158);
    if (bVar1) {
      if ((local_158.entry_p_)->d_name[0] != '.') {
        std::operator+(&local_268,local_270,"/");
        std::operator+(&local_248,&local_268,(local_158.entry_p_)->d_name);
        iVar2 = stat(local_248._M_dataplus._M_p,&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        if (-1 < iVar2) {
          local_274 = local_228.st_mode;
          pcVar4 = "(/";
          if ((local_228.st_mode >> 0xe & 1) == 0) {
            pcVar4 = "\x01";
            local_274._0_2_ = (short)local_228.st_mode;
            bVar1 = -1 < (short)local_274;
            if (bVar1) goto LAB_0021b2c1;
          }
          std::operator<<(out,"<tr>");
          poVar3 = std::operator<<(out,"<td><code><a href=\'");
          std::__cxx11::string::string((string *)&local_268,(local_158.entry_p_)->d_name,&local_275)
          ;
          util::urlencode(&local_248,&local_268);
          poVar3 = std::operator<<(poVar3,(string *)&local_248);
          poVar3 = std::operator<<(poVar3,pcVar4 + 1);
          poVar3 = std::operator<<(poVar3,"\'>");
          std::__cxx11::string::string((string *)&local_198,(local_158.entry_p_)->d_name,&local_276)
          ;
          util::escape(&local_178,&local_198);
          poVar3 = std::operator<<(poVar3,(string *)&local_178);
          poVar3 = std::operator<<(poVar3,pcVar4 + 1);
          std::operator<<(poVar3,"</a></code></td>");
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)&local_268);
          pcVar4 = "<td>";
          poVar3 = std::operator<<(out,"<td>");
          booster::locale::as::strftime
                    ((char *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),(size_t)pcVar4,__format,
                     (tm *)CONCAT71(in_register_00000009,uVar5));
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::operator<<(poVar3,"</td><td>&nbsp;</td>");
          pcVar4 = "<td> <strong>-</strong> </td>";
          poVar3 = out;
          if ((short)local_274 < 0) {
            poVar3 = std::operator<<(out,"<td>");
            booster::locale::as::number((ios_base *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)));
            poVar3 = std::ostream::_M_insert<long>((long)poVar3);
            pcVar4 = "</td>";
          }
          std::operator<<(poVar3,pcVar4);
          std::operator<<(out,"</tr>\n");
        }
      }
      goto LAB_0021b2c1;
    }
    std::operator<<(out,"</tbody>\n</table>\n");
    std::operator<<(out,"<p>CppCMS-Embedded/2.0.0.beta2</p>\n");
    std::operator<<(out,"</body>\n");
  }
  directory::~directory(&local_158);
  return;
}

Assistant:

void file_server::list_dir(std::string const &url,std::string const &path)
{
	cppcms::impl::directory d;
	if(!d.open(path)) {
		show404();
		return;
	}
	
#ifdef CPPCMS_WIN_NATIVE
	response().content_type("text/html; charset=UTF-8");
#endif
	std::ostream &out = response().out();
	out << "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n"
	       "     \"http://www.w3.org/TR/html4/loose.dtd\">\n";

	out << "<html><head><title>Directory Listing</title></head>\n"
		"<body><h1>Index of " << util::escape(url) << "</h1>\n";
	out << booster::locale::as::gmt;
	//out <<"<table cellpadding='0' cellspacing='2' border='0' >\n";
	out <<"<table>\n";
	out <<"<thead><tr><td width='60%'>File</td><td width='20%' >Date</td><td width='5%'>&nbsp;</td><td width='15%'>Size</td></tr></thead>\n"
		"<tbody>\n";
	if(url!="/" && !url.empty()) {
		out << "<tr><td><code><a href='../' >..</a></code></td><td>&nbsp;</td><td>&nbsp;</td><td>&nbsp;</td></tr>\n";
	}
	out << booster::locale::as::ftime("%Y-%m-%d %H:%M:%S");
	while(d.next()) {
		if(memcmp(d.name(),".",1) == 0)
			continue;
		port_stat st;
		if(get_stat((path + "/" + d.name()).c_str(),&st) < 0)
			continue;
		char const *add="";
		if(st.st_mode & S_IFDIR)
			add="/";
		else if(st.st_mode & S_IFREG)
			;
		else 
			continue;
		out << "<tr>";
		out << "<td><code><a href='" 
			<< util::urlencode(d.name()) << add << "'>" << util::escape(d.name()) << add << "</a></code></td>";
		out << "<td>" << booster::locale::as::strftime << st.st_mtime <<"</td><td>&nbsp;</td>";
		if(st.st_mode & S_IFREG)
			out << "<td>" << booster::locale::as::number << st.st_size <<"</td>";
		else
			out << "<td> <strong>-</strong> </td>";
		out <<"</tr>\n";
	}
	out <<"</tbody>\n</table>\n";
	out <<"<p>CppCMS-Embedded/" CPPCMS_PACKAGE_VERSION "</p>\n";
	out <<"</body>\n";
}